

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O1

Error asmjit::X86Logging_formatImmBits(StringBuilder *sb,uint32_t u8,ImmBits *bits,uint32_t count)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  Error EVar4;
  uint uVar5;
  ulong uVar6;
  char *__s;
  int iVar7;
  bool bVar8;
  bool bVar9;
  char buf [64];
  uint local_94;
  char local_78 [72];
  
  bVar8 = count != 0;
  if (count == 0) {
    bVar9 = true;
  }
  else {
    uVar6 = 0;
    iVar7 = 0;
    do {
      uVar5 = (bits[uVar6].mask & u8) >> (bits[uVar6].shift & 0x1f);
      if (bits[uVar6].mode == '\x01') {
        __s = local_78;
        snprintf(__s,0x40,bits[uVar6].text);
LAB_0016ae94:
        if (*__s == '\0') {
          bVar9 = false;
          uVar5 = local_94;
        }
        else {
          iVar3 = iVar7 + 1;
          bVar9 = true;
          uVar5 = StringBuilder::_opChar(sb,1,(iVar7 != 0) << 6 | 0x3c);
          iVar7 = iVar3;
          if (uVar5 == 0) {
            EVar4 = StringBuilder::_opString(sb,1,__s,0xffffffffffffffff);
            bVar9 = EVar4 != 0;
            uVar5 = local_94;
            if (bVar9) {
              uVar5 = EVar4;
            }
          }
        }
      }
      else {
        if (bits[uVar6].mode == '\0') {
          __s = bits[uVar6].text;
          if (uVar5 != 0) {
            uVar2 = 0;
            do {
              do {
                cVar1 = *__s;
                __s = __s + 1;
              } while (cVar1 != '\0');
              uVar2 = uVar2 + 1;
            } while (uVar2 != uVar5);
          }
          goto LAB_0016ae94;
        }
        bVar9 = true;
        local_94 = 4;
        uVar5 = local_94;
      }
      local_94 = uVar5;
      if (bVar9) break;
      uVar6 = uVar6 + 1;
      bVar8 = uVar6 < count;
    } while (uVar6 != count);
    bVar9 = iVar7 == 0;
    bits = (ImmBits *)(ulong)local_94;
  }
  EVar4 = 0;
  if (bVar8) {
    EVar4 = (Error)bits;
  }
  if (!bVar9 && !bVar8) {
    EVar4 = StringBuilder::_opChar(sb,1,'>');
  }
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE static Error X86Logging_formatImmBits(StringBuilder& sb, uint32_t u8, const ImmBits* bits, uint32_t count) noexcept {
  uint32_t n = 0;
  char buf[64];

  for (uint32_t i = 0; i < count; i++) {
    const ImmBits& spec = bits[i];

    uint32_t value = (u8 & static_cast<uint32_t>(spec.mask)) >> spec.shift;
    const char* str = nullptr;

    switch (spec.mode) {
      case ImmBits::kModeLookup:
        str = Utils::findPackedString(spec.text, value);
        break;

      case ImmBits::kModeFormat:
        snprintf(buf, sizeof(buf), spec.text, static_cast<unsigned int>(value));
        str = buf;
        break;

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (!str[0])
      continue;

    ASMJIT_PROPAGATE(sb.appendChar(++n == 1 ? '<' : '|'));
    ASMJIT_PROPAGATE(sb.appendString(str));
  }

  return n ? sb.appendChar('>') : static_cast<Error>(kErrorOk);
}